

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.c
# Opt level: O2

int enet_initialize_with_callbacks(ENetVersion version,ENetCallbacks *inits)

{
  _func_void_void_ptr *p_Var1;
  _func_void_ptr_size_t *p_Var2;
  _func_void_void_ptr *p_Var3;
  int iVar4;
  
  if (0x102ff < version) {
    p_Var1 = inits->free;
    if (inits->malloc == (_func_void_ptr_size_t *)0x0) {
      p_Var2 = (_func_void_ptr_size_t *)callbacks_0;
      p_Var3 = (_func_void_void_ptr *)callbacks_1;
      if (p_Var1 == (_func_void_void_ptr *)0x0) goto LAB_0010255e;
    }
    else {
      p_Var2 = inits->malloc;
      p_Var3 = p_Var1;
      if (p_Var1 != (_func_void_void_ptr *)0x0) {
LAB_0010255e:
        callbacks_1 = p_Var3;
        callbacks_0 = p_Var2;
        if (inits->no_memory == (_func_void *)0x0) {
          return 0;
        }
        callbacks_2 = inits->no_memory;
        iVar4 = enet_initialize();
        return iVar4;
      }
    }
  }
  return -1;
}

Assistant:

int
enet_initialize_with_callbacks (ENetVersion version, const ENetCallbacks * inits)
{
   if (version < ENET_VERSION_CREATE (1, 3, 0))
     return -1;

   if (inits -> malloc != NULL || inits -> free != NULL)
   {
      if (inits -> malloc == NULL || inits -> free == NULL)
        return -1;

      callbacks.malloc = inits -> malloc;
      callbacks.free = inits -> free;
   }
      
   if (inits -> no_memory != NULL)
     callbacks.no_memory = inits -> no_memory;

   return enet_initialize ();
}